

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

bool pstore::command_line::details::check_for_missing<std::ostream>
               (string *program_name,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  option *this;
  bool bVar1;
  uint uVar2;
  int iVar3;
  options_container *this_00;
  reference ppoVar4;
  string *psVar5;
  ostream *poVar6;
  czstring pcVar7;
  option *opt;
  iterator __end3;
  iterator __begin3;
  options_container *__range3;
  uint positional_missing;
  bool ok;
  basic_ostream<char,_std::char_traits<char>_> *errs_local;
  string *program_name_local;
  
  __range3._7_1_ = true;
  __range3._0_4_ = 0;
  this_00 = option::all_abi_cxx11_();
  __end3 = std::__cxx11::
           list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::
           begin(this_00);
  opt = (option *)
        std::__cxx11::
        list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::end
                  (this_00);
  while (bVar1 = std::operator!=(&__end3,(_Self *)&opt), bVar1) {
    ppoVar4 = std::_List_iterator<pstore::command_line::option_*>::operator*(&__end3);
    this = *ppoVar4;
    uVar2 = (*this->_vptr_option[3])();
    if (((1 < uVar2) && (uVar2 == 2 || uVar2 == 3)) &&
       (iVar3 = (*this->_vptr_option[4])(), iVar3 == 0)) {
      uVar2 = (*this->_vptr_option[9])();
      if ((uVar2 & 1) == 0) {
        psVar5 = stream_trait<char>::out_string(program_name);
        poVar6 = std::operator<<(errs,(string *)psVar5);
        pcVar7 = stream_trait<char>::out_text(": option \'");
        poVar6 = std::operator<<(poVar6,pcVar7);
        psVar5 = option::name_abi_cxx11_(this);
        psVar5 = stream_trait<char>::out_string(psVar5);
        poVar6 = std::operator<<(poVar6,(string *)psVar5);
        pcVar7 = stream_trait<char>::out_text("\' must be specified at least once\n");
        std::operator<<(poVar6,pcVar7);
      }
      else {
        __range3._0_4_ = (uint)__range3 + 1;
      }
      __range3._7_1_ = false;
    }
    std::_List_iterator<pstore::command_line::option_*>::operator++(&__end3);
  }
  if ((uint)__range3 == 1) {
    psVar5 = stream_trait<char>::out_string(program_name);
    poVar6 = std::operator<<(errs,(string *)psVar5);
    pcVar7 = stream_trait<char>::out_text(": a positional argument was missing\n");
    std::operator<<(poVar6,pcVar7);
  }
  else if (1 < (uint)__range3) {
    psVar5 = stream_trait<char>::out_string(program_name);
    poVar6 = std::operator<<(errs,(string *)psVar5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)__range3);
    pcVar7 = stream_trait<char>::out_text(": positional arguments are missing\n");
    std::operator<<(poVar6,pcVar7);
  }
  return __range3._7_1_;
}

Assistant:

bool check_for_missing (std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                using pstore::command_line::num_occurrences_flag;
                using pstore::command_line::option;

                bool ok = true;
                auto positional_missing = 0U;

                for (option const * const opt : option::all ()) {
                    switch (opt->get_num_occurrences_flag ()) {
                    case num_occurrences_flag::required:
                    case num_occurrences_flag::one_or_more:
                        if (opt->get_num_occurrences () == 0U) {
                            if (opt->is_positional ()) {
                                ++positional_missing;
                            } else {
                                errs << str::out_string (program_name)
                                     << str::out_text (": option '")
                                     << str::out_string (opt->name ())
                                     << str::out_text ("' must be specified at least once\n");
                            }
                            ok = false;
                        }
                        break;
                    case num_occurrences_flag::optional:
                    case num_occurrences_flag::zero_or_more: break;
                    }
                }

                if (positional_missing == 1U) {
                    errs << str::out_string (program_name)
                         << str::out_text (": a positional argument was missing\n");
                } else if (positional_missing > 1U) {
                    errs << str::out_string (program_name) << positional_missing
                         << str::out_text (": positional arguments are missing\n");
                }

                return ok;
            }